

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CDirectiveArea.cpp
# Opt level: O3

bool __thiscall CDirectiveAutoRegion::Validate(CDirectiveAutoRegion *this,ValidateState *state)

{
  long lVar1;
  long lVar2;
  CAssemblerCommand *pCVar3;
  bool bVar4;
  byte bVar5;
  int iVar6;
  int64_t iVar7;
  Architecture *pAVar8;
  long *args;
  int64_t maxRange;
  int64_t minRange;
  ValidateState contentValidation;
  long *local_58;
  long local_50;
  undefined1 local_48;
  undefined7 uStack_47;
  char *pcStack_40;
  undefined8 local_38;
  
  iVar7 = FileManager::getVirtualAddress(g_fileManager);
  this->resetPosition = iVar7;
  local_38 = *(undefined8 *)&state->passes;
  _local_48 = CONCAT71((int7)((ulong)*(undefined8 *)state >> 8),1);
  pcStack_40 = "region";
  if (0 < state->passes) {
    lVar1 = this->position;
    lVar2 = this->contentSize;
    local_50 = -1;
    local_58 = (long *)0xffffffffffffffff;
    if ((((this->minRangeExpression).expression.
          super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          (element_type *)0x0) ||
        (bVar4 = Expression::evaluateInteger<long>(&this->minRangeExpression,&local_50), bVar4)) &&
       (((this->maxRangeExpression).expression.
         super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
         (element_type *)0x0 ||
        (bVar4 = Expression::evaluateInteger<long>(&this->maxRangeExpression,(long *)&local_58),
        bVar4)))) {
      iVar7 = FileManager::getOpenFileID(g_fileManager);
      this->fileID = iVar7;
      args = local_58;
      bVar4 = Allocations::allocateSubArea
                        (iVar7,&this->position,local_50,(int64_t)local_58,this->contentSize);
      if (bVar4) {
        pAVar8 = Architecture::current();
        (*pAVar8->_vptr_Architecture[3])(pAVar8);
        FileManager::seekVirtual(g_fileManager,this->position);
        CAssemblerCommand::applyFileInfo
                  ((this->content)._M_t.
                   super___uniq_ptr_impl<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_CAssemblerCommand_*,_std::default_delete<CAssemblerCommand>_>
                   .super__Head_base<0UL,_CAssemblerCommand_*,_false>._M_head_impl);
        pCVar3 = (this->content)._M_t.
                 super___uniq_ptr_impl<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_CAssemblerCommand_*,_std::default_delete<CAssemblerCommand>_>
                 .super__Head_base<0UL,_CAssemblerCommand_*,_false>._M_head_impl;
        iVar6 = (*pCVar3->_vptr_CAssemblerCommand[2])(pCVar3,&local_48);
        iVar7 = FileManager::getVirtualAddress(g_fileManager);
        this->contentSize = iVar7 - this->position;
        CAssemblerCommand::applyFileInfo(&this->super_CAssemblerCommand);
        FileManager::seekVirtual(g_fileManager,this->resetPosition);
        bVar5 = (lVar2 != this->contentSize || lVar1 != this->position) | (byte)iVar6;
      }
      else {
        Logger::queueError<long>((Logger *)0x1,0x1940bd,(char *)&this->contentSize,args);
        bVar5 = Allocations::canTrimSpace();
      }
    }
    else {
      Logger::queueError<>(Error,"Invalid range expression for .autoregion");
      bVar5 = 0;
    }
    return (bool)bVar5;
  }
  iVar7 = FileManager::getVirtualAddress(g_fileManager);
  this->position = iVar7;
  CAssemblerCommand::applyFileInfo
            ((this->content)._M_t.
             super___uniq_ptr_impl<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>._M_t.
             super__Tuple_impl<0UL,_CAssemblerCommand_*,_std::default_delete<CAssemblerCommand>_>.
             super__Head_base<0UL,_CAssemblerCommand_*,_false>._M_head_impl);
  pCVar3 = (this->content)._M_t.
           super___uniq_ptr_impl<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>._M_t.
           super__Tuple_impl<0UL,_CAssemblerCommand_*,_std::default_delete<CAssemblerCommand>_>.
           super__Head_base<0UL,_CAssemblerCommand_*,_false>._M_head_impl;
  (*pCVar3->_vptr_CAssemblerCommand[2])(pCVar3,&local_48);
  iVar7 = FileManager::getVirtualAddress(g_fileManager);
  this->contentSize = iVar7 - this->position;
  FileManager::seekVirtual(g_fileManager,this->resetPosition);
  return true;
}

Assistant:

bool CDirectiveAutoRegion::Validate(const ValidateState &state)
{
	resetPosition = g_fileManager->getVirtualAddress();

	ValidateState contentValidation = state;
	contentValidation.noFileChange = true;
	contentValidation.noFileChangeDirective = "region";

	// We need at least one full pass run before we can get an address.
	if (state.passes < 1)
	{
		// Just calculate contentSize.
		position = g_fileManager->getVirtualAddress();
		content->applyFileInfo();
		content->Validate(contentValidation);
		contentSize = g_fileManager->getVirtualAddress() - position;

		g_fileManager->seekVirtual(resetPosition);
		return true;
	}

	int64_t oldPosition = position;
	int64_t oldContentSize = contentSize;

	int64_t minRange = -1;
	int64_t maxRange = -1;
	if (minRangeExpression.isLoaded())
	{
		if (!minRangeExpression.evaluateInteger(minRange))
		{
			Logger::queueError(Logger::Error, "Invalid range expression for .autoregion");
			return false;
		}
	}
	if (maxRangeExpression.isLoaded())
	{
		if (!maxRangeExpression.evaluateInteger(maxRange))
		{
			Logger::queueError(Logger::Error, "Invalid range expression for .autoregion");
			return false;
		}
	}

	fileID = g_fileManager->getOpenFileID();
	if (!Allocations::allocateSubArea(fileID, position, minRange, maxRange, contentSize))
	{
		Logger::queueError(Logger::Error, "No space available for .autoregion of size %d", contentSize);
		// We might be able to do better next time.
		return Allocations::canTrimSpace();
	}

	Architecture::current().NextSection();
	g_fileManager->seekVirtual(position);

	content->applyFileInfo();
	bool result = content->Validate(contentValidation);
	contentSize = g_fileManager->getVirtualAddress() - position;

	// restore info of this command
	applyFileInfo();
	g_fileManager->seekVirtual(resetPosition);

	if (position != oldPosition || contentSize != oldContentSize)
		result = true;

	return result;
}